

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O1

Type * QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
       ::instance(void)

{
  int iVar1;
  Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry> *this;
  
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>>
      ::instance()::holder == '\0') {
    this = (Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry> *)
           &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>>
            ::instance()::holder;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>
      ::Holder(this);
      __cxa_atexit(QtGlobalStatic::
                   Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>::
                   ~Holder,&instance::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>>
                           ::instance()::holder);
    }
  }
  return (Type *)&instance::holder;
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }